

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O3

void * ym2203_init(void *param,UINT32 clock,UINT32 rate,FM_TIMERHANDLER timer_handler,
                  FM_IRQHANDLER IRQHandler)

{
  uint uVar1;
  void *pvVar2;
  uint uVar3;
  
  pvVar2 = calloc(1,0x4b40);
  if (pvVar2 != (void *)0x0) {
    init_tables();
    *(void **)((long)pvVar2 + 0x110) = param;
    *(undefined1 *)((long)pvVar2 + 0x108) = 1;
    *(long *)((long)pvVar2 + 0x5a0) = (long)pvVar2 + 0x4678;
    *(UINT32 *)((long)pvVar2 + 0x118) = clock;
    *(UINT32 *)((long)pvVar2 + 0x11c) = rate;
    uVar3 = rate - clock / 0x48;
    uVar1 = -uVar3;
    if (0 < (int)uVar3) {
      uVar1 = uVar3;
    }
    *(bool *)((long)pvVar2 + 0x109) = uVar1 < 3;
    *(FM_TIMERHANDLER *)((long)pvVar2 + 0x548) = timer_handler;
    *(FM_IRQHANDLER *)((long)pvVar2 + 0x550) = IRQHandler;
    *(code **)((long)pvVar2 + 0x558) = ssgdummy_set_clock;
    *(code **)((long)pvVar2 + 0x560) = ssgdummy_write;
    *(code **)((long)pvVar2 + 0x568) = ssgdummy_read;
    *(code **)((long)pvVar2 + 0x570) = ssgdummy_reset;
  }
  return pvVar2;
}

Assistant:

void * ym2203_init(void *param, UINT32 clock, UINT32 rate,
				FM_TIMERHANDLER timer_handler,FM_IRQHANDLER IRQHandler)
{
	YM2203 *F2203;

	/* allocate ym2203 state space */
	F2203 = (YM2203 *)calloc(1,sizeof(YM2203));
	if( F2203==NULL)
		return NULL;

	/* allocate total level table (128kb space) */
	init_tables();

	F2203->OPN.ST.param = param;
	F2203->OPN.type = TYPE_YM2203;
	F2203->OPN.P_CH = F2203->CH;
	F2203->OPN.ST.clock = clock;
	F2203->OPN.ST.rate = rate;
	OPNCheckNativeSampleRate(&F2203->OPN);

	F2203->OPN.ST.timer_handler = timer_handler;
	F2203->OPN.ST.IRQ_Handler   = IRQHandler;
	OPNLinkSSG(&F2203->OPN, NULL, NULL);
	OPNSetSmplRateChgCallback(&F2203->OPN, NULL, NULL);

	ym2203_set_mute_mask(F2203, 0x00);

	return F2203;
}